

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::TransformDerivative::asAdjointTransformWrenchDerivative
          (Matrix6x6 *__return_storage_ptr__,TransformDerivative *this,Transform *transform)

{
  double *pdVar1;
  Position *pPVar2;
  Rotation *pRVar3;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> dR;
  undefined1 local_130 [28];
  uint uStack_114;
  variable_if_dynamic<long,__1> local_110;
  variable_if_dynamic<long,__1> vStack_108;
  double local_100;
  undefined4 uStack_f8;
  uint uStack_f4;
  undefined8 local_f0;
  undefined1 local_e8 [32];
  variable_if_dynamic<long,__1> local_c8;
  variable_if_dynamic<long,__1> local_c0;
  Index local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  local_b0;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  dR.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->rotDerivative).m_data;
  pPVar2 = Transform::getPosition(transform);
  pRVar3 = Transform::getRotation(transform);
  local_110.m_value = 0;
  vStack_108.m_value = 0;
  local_100 = 2.96439387504748e-323;
  local_130._0_8_ = __return_storage_ptr__;
  local_130._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_130,&dR);
  local_130._0_8_ = __return_storage_ptr__->m_data + 3;
  local_110.m_value = 0;
  vStack_108.m_value = 3;
  local_100 = 2.96439387504748e-323;
  local_130._16_8_ = __return_storage_ptr__;
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
             *)local_130);
  vStack_108.m_value = (long)(this->posDerivative).m_data[0];
  uStack_f8 = (undefined4)vStack_108.m_value;
  local_130._0_8_ = (PointerType)0x0;
  pdVar1 = (this->posDerivative).m_data + 1;
  local_100 = *pdVar1;
  local_130._24_4_ = *(undefined4 *)((this->posDerivative).m_data + 2);
  uStack_114 = *(uint *)((long)(this->posDerivative).m_data + 0x14) ^ 0x80000000;
  local_130._16_8_ = (ulong)*pdVar1 ^ 0x8000000000000000;
  local_110.m_value = 0;
  uStack_f4 = (uint)((ulong)vStack_108.m_value >> 0x20) ^ 0x80000000;
  local_f0 = 0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (pPVar2->super_Vector3).m_data[0];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7].
  _0_4_ = SUB84(local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[5],0);
  local_b0.m_rhs.m_lhs = &local_78;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7].
  _4_4_ = (uint)((ulong)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[5] >> 0x20) ^ 0x80000000;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2].
  _0_4_ = *(undefined4 *)((pPVar2->super_Vector3).m_data + 1);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6].
  _4_4_ = *(uint *)((long)(pPVar2->super_Vector3).m_data + 0xc);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3].
  _0_4_ = *(undefined4 *)((pPVar2->super_Vector3).m_data + 2);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2].
  _4_4_ = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6]._4_4_ ^ 0x80000000;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3].
  _4_4_ = *(uint *)((long)(pPVar2->super_Vector3).m_data + 0x14) ^ 0x80000000;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_b0.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = dR.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  local_b0.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _8_2_ = dR.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._8_2_;
  local_e8._0_8_ = __return_storage_ptr__->m_data + 0x12;
  local_c8.m_value = 3;
  local_c0.m_value = 0;
  local_b8 = 6;
  local_e8._16_8_ = __return_storage_ptr__;
  local_b0.m_lhs.m_lhs = (LhsNested)local_130;
  local_b0.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pRVar3;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6].
  _0_4_ = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2]._0_4_;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_e8,&local_b0);
  local_130._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_110.m_value = 3;
  vStack_108.m_value = 3;
  local_100 = 2.96439387504748e-323;
  local_130._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_130,&dR);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 TransformDerivative::asAdjointTransformWrenchDerivative(const Transform& transform) const
{
    Matrix6x6 ret;

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,3>(0,3).setZero();
    retEigen.block<3,3>(3,0) = mySkeww(dp)*R + mySkeww(p)*dR;
    retEigen.block<3,3>(3,3) = dR;

    return ret;
}